

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinTlMode::emulate_mthd(MthdKelvinTlMode *this)

{
  int iVar1;
  MthdKelvinTlMode *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0xfffbffff |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3f) << 0x12
                 );
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0x3fffffff |
           (this->super_SingleMthdTest).super_MthdTest.val << 0x1e;
      if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type == 0x30) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0xfffeffff
             | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37) >> 0x3f) <<
                     0x10);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0xfffdffff
             | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3f) <<
                     0x11);
      }
      pgraph_flush_xf_mode(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    }
    else {
      iVar1 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
      if (iVar1 < 6) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a &
             0xfffffffb |
             (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3f) << 2)
        ;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a & 0xefffffff
           | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37) >> 0x3f) <<
                   0x1c);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c & 0x3fffffff
           | (this->super_SingleMthdTest).super_MthdTest.val << 0x1e;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c & 0xf7ffffff
           | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3f) <<
                   0x1b);
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x5d,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a,true
                   );
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x5f,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c,true
                   );
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (chipset.card_type < 0x40) {
				insrt(exp.xf_mode_b, 18, 1, extr(val, 2, 1));
				insrt(exp.xf_mode_b, 30, 2, extr(val, 0, 2));
				if (chipset.card_type == 0x30) {
					insrt(exp.xf_mode_b, 16, 1, extr(val, 8, 1));
					insrt(exp.xf_mode_b, 17, 1, extr(val, 4, 1));
				}
				pgraph_flush_xf_mode(&exp);
			} else {
				if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE)
					insrt(exp.bundle_xf_a, 2, 1, extr(val, 2, 1));
				insrt(exp.bundle_xf_a, 28, 1, extr(val, 8, 1));
				insrt(exp.bundle_xf_c, 30, 2, extr(val, 0, 2));
				insrt(exp.bundle_xf_c, 27, 1, extr(val, 4, 1));
				pgraph_bundle(&exp, BUNDLE_XF_A, 0, exp.bundle_xf_a, true);
				pgraph_bundle(&exp, BUNDLE_XF_C, 0, exp.bundle_xf_c, true);
			}
		}
	}